

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  size_t __n;
  ulong uVar2;
  int32_t iVar3;
  undefined8 *puVar4;
  Type *s;
  uint8_t *puVar5;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  int iVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,*(int *)(puVar4 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,*(int *)(puVar4 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  iVar7 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    s = internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this->dependency_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::VerifyUtf8String
              ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.dependency");
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\x1a';
      target[1] = (uint8_t)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,target);
    }
  }
  iVar7 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->message_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::DescriptorProto>
                       (4,value,puVar5,stream);
  }
  iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::EnumDescriptorProto>
                       (5,value_00,puVar5,stream);
  }
  iVar7 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                         (&(this->service_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::
             InternalWriteMessage<google::protobuf::ServiceDescriptorProto>
                       (6,value_01,puVar5,stream);
  }
  iVar7 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(this->extension_).super_RepeatedPtrFieldBase,iVar6);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::FieldDescriptorProto>
                       (7,value_02,puVar5,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::FileOptions>
                       (8,this->options_,puVar5,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::InternalWriteMessage<google::protobuf::SourceCodeInfo>
                       (9,this->source_code_info_,puVar5,stream);
  }
  iVar7 = (this->public_dependency_).current_size_;
  iVar6 = 0;
  if (iVar7 < 1) {
    iVar7 = iVar6;
  }
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar3 = _internal_public_dependency(this,iVar6);
    target = internal::WireFormatLite::WriteInt32ToArray(10,iVar3,puVar5);
  }
  iVar7 = (this->weak_dependency_).current_size_;
  iVar6 = 0;
  if (iVar7 < 1) {
    iVar7 = iVar6;
  }
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar3 = _internal_weak_dependency(this,iVar6);
    target = internal::WireFormatLite::WriteInt32ToArray(0xb,iVar3,puVar5);
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,*(int *)(puVar4 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,
                        (string *)((ulong)(this->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

uint8_t* FileDescriptorProto::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}